

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<VkSpecParser::TypedName>::emplace<VkSpecParser::TypedName>
          (QGenericArrayOps<VkSpecParser::TypedName> *this,qsizetype i,TypedName *args)

{
  qsizetype *pqVar1;
  TypedName **ppTVar2;
  Data *pDVar3;
  TypedName *pTVar4;
  QArrayData *pQVar5;
  char16_t *pcVar6;
  qsizetype qVar7;
  QArrayData *pQVar8;
  char16_t *pcVar9;
  qsizetype qVar10;
  QArrayData *pQVar11;
  char16_t *pcVar12;
  qsizetype qVar13;
  Data *pDVar14;
  longlong __old_val;
  QTypedArrayData<char16_t> *__old_val_1;
  char16_t *__old_val_2;
  longlong __old_val_3;
  long in_FS_OFFSET;
  bool bVar15;
  Inserter local_d0;
  TypedName local_80;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QArrayDataPointer<VkSpecParser::TypedName>).d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_00109295:
    pQVar5 = &((args->name).d.d)->super_QArrayData;
    (args->name).d.d = (Data *)0x0;
    pcVar6 = (args->name).d.ptr;
    (args->name).d.ptr = (char16_t *)0x0;
    qVar7 = (args->name).d.size;
    (args->name).d.size = 0;
    pQVar8 = &((args->type).d.d)->super_QArrayData;
    (args->type).d.d = (Data *)0x0;
    pcVar9 = (args->type).d.ptr;
    (args->type).d.ptr = (char16_t *)0x0;
    qVar10 = (args->type).d.size;
    (args->type).d.size = 0;
    pQVar11 = &((args->typeSuffix).d.d)->super_QArrayData;
    (args->typeSuffix).d.d = (Data *)0x0;
    pcVar12 = (args->typeSuffix).d.ptr;
    (args->typeSuffix).d.ptr = (char16_t *)0x0;
    qVar13 = (args->typeSuffix).d.size;
    (args->typeSuffix).d.size = 0;
    bVar15 = (this->super_QArrayDataPointer<VkSpecParser::TypedName>).size != 0;
    local_80.name.d.d = (Data *)pQVar5;
    local_80.name.d.ptr = pcVar6;
    local_80.name.d.size = qVar7;
    local_80.type.d.d = (Data *)pQVar8;
    local_80.type.d.ptr = pcVar9;
    local_80.type.d.size = qVar10;
    local_80.typeSuffix.d.d = (Data *)pQVar11;
    local_80.typeSuffix.d.ptr = pcVar12;
    local_80.typeSuffix.d.size = qVar13;
    QArrayDataPointer<VkSpecParser::TypedName>::detachAndGrow
              (&this->super_QArrayDataPointer<VkSpecParser::TypedName>,(uint)(i == 0 && bVar15),1,
               (TypedName **)0x0,(QArrayDataPointer<VkSpecParser::TypedName> *)0x0);
    if (i == 0 && bVar15) {
      pTVar4 = (this->super_QArrayDataPointer<VkSpecParser::TypedName>).ptr;
      local_80.name.d.d = (Data *)0x0;
      pTVar4[-1].name.d.d = (Data *)pQVar5;
      local_80.name.d.ptr = (char16_t *)0x0;
      pTVar4[-1].name.d.ptr = pcVar6;
      local_80.name.d.size = 0;
      pTVar4[-1].name.d.size = qVar7;
      local_80.type.d.d = (Data *)0x0;
      pTVar4[-1].type.d.d = (Data *)pQVar8;
      local_80.type.d.ptr = (char16_t *)0x0;
      pTVar4[-1].type.d.ptr = pcVar9;
      local_80.type.d.size = 0;
      pTVar4[-1].type.d.size = qVar10;
      local_80.typeSuffix.d.d = (Data *)0x0;
      pTVar4[-1].typeSuffix.d.d = (Data *)pQVar11;
      local_80.typeSuffix.d.ptr = (char16_t *)0x0;
      pTVar4[-1].typeSuffix.d.ptr = pcVar12;
      local_80.typeSuffix.d.size = 0;
      pTVar4[-1].typeSuffix.d.size = qVar13;
      (this->super_QArrayDataPointer<VkSpecParser::TypedName>).ptr = pTVar4 + -1;
      pqVar1 = &(this->super_QArrayDataPointer<VkSpecParser::TypedName>).size;
      *pqVar1 = *pqVar1 + 1;
    }
    else {
      local_d0.sourceCopyConstruct = 0;
      local_d0.nSource = 0;
      local_d0.move = 0;
      local_d0.sourceCopyAssign = 0;
      local_d0.end = (TypedName *)0x0;
      local_d0.last = (TypedName *)0x0;
      local_d0.where = (TypedName *)0x0;
      local_d0.begin = (this->super_QArrayDataPointer<VkSpecParser::TypedName>).ptr;
      local_d0.size = (this->super_QArrayDataPointer<VkSpecParser::TypedName>).size;
      local_d0.data = &this->super_QArrayDataPointer<VkSpecParser::TypedName>;
      Inserter::insertOne(&local_d0,i,&local_80);
      (local_d0.data)->ptr = local_d0.begin;
      (local_d0.data)->size = local_d0.size;
      if (&(local_80.typeSuffix.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_80.typeSuffix.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_80.typeSuffix.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_80.typeSuffix.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
            _M_i == 0) {
          QArrayData::deallocate(&(local_80.typeSuffix.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    if (&(local_80.type.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_80.type.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_80.type.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_80.type.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_80.type.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_80.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_80.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_80.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_80.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_80.name.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    if (((this->super_QArrayDataPointer<VkSpecParser::TypedName>).size == i) &&
       (pTVar4 = (this->super_QArrayDataPointer<VkSpecParser::TypedName>).ptr,
       (pDVar3->super_QArrayData).alloc - i !=
       ((long)((long)pTVar4 -
              ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
       -0x71c71c71c71c71c7)) {
      pDVar14 = (args->name).d.d;
      (args->name).d.d = (Data *)0x0;
      pTVar4[i].name.d.d = pDVar14;
      pcVar6 = (args->name).d.ptr;
      (args->name).d.ptr = (char16_t *)0x0;
      pTVar4[i].name.d.ptr = pcVar6;
      qVar7 = (args->name).d.size;
      (args->name).d.size = 0;
      pTVar4[i].name.d.size = qVar7;
      pDVar14 = (args->type).d.d;
      (args->type).d.d = (Data *)0x0;
      pTVar4[i].type.d.d = pDVar14;
      pcVar6 = (args->type).d.ptr;
      (args->type).d.ptr = (char16_t *)0x0;
      pTVar4[i].type.d.ptr = pcVar6;
      qVar7 = (args->type).d.size;
      (args->type).d.size = 0;
      pTVar4[i].type.d.size = qVar7;
      pDVar14 = (args->typeSuffix).d.d;
      (args->typeSuffix).d.d = (Data *)0x0;
      pTVar4[i].typeSuffix.d.d = pDVar14;
      pcVar6 = (args->typeSuffix).d.ptr;
      (args->typeSuffix).d.ptr = (char16_t *)0x0;
      pTVar4[i].typeSuffix.d.ptr = pcVar6;
      qVar7 = (args->typeSuffix).d.size;
      (args->typeSuffix).d.size = 0;
      pTVar4[i].typeSuffix.d.size = qVar7;
    }
    else {
      if ((i != 0) ||
         (pTVar4 = (this->super_QArrayDataPointer<VkSpecParser::TypedName>).ptr,
         (TypedName *)((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
         == pTVar4)) goto LAB_00109295;
      pDVar14 = (args->name).d.d;
      (args->name).d.d = (Data *)0x0;
      pTVar4[-1].name.d.d = pDVar14;
      pcVar6 = (args->name).d.ptr;
      (args->name).d.ptr = (char16_t *)0x0;
      pTVar4[-1].name.d.ptr = pcVar6;
      qVar7 = (args->name).d.size;
      (args->name).d.size = 0;
      pTVar4[-1].name.d.size = qVar7;
      pDVar14 = (args->type).d.d;
      (args->type).d.d = (Data *)0x0;
      pTVar4[-1].type.d.d = pDVar14;
      pcVar6 = (args->type).d.ptr;
      (args->type).d.ptr = (char16_t *)0x0;
      pTVar4[-1].type.d.ptr = pcVar6;
      qVar7 = (args->type).d.size;
      (args->type).d.size = 0;
      pTVar4[-1].type.d.size = qVar7;
      pDVar14 = (args->typeSuffix).d.d;
      (args->typeSuffix).d.d = (Data *)0x0;
      pTVar4[-1].typeSuffix.d.d = pDVar14;
      pcVar6 = (args->typeSuffix).d.ptr;
      (args->typeSuffix).d.ptr = (char16_t *)0x0;
      pTVar4[-1].typeSuffix.d.ptr = pcVar6;
      qVar7 = (args->typeSuffix).d.size;
      (args->typeSuffix).d.size = 0;
      pTVar4[-1].typeSuffix.d.size = qVar7;
      ppTVar2 = &(this->super_QArrayDataPointer<VkSpecParser::TypedName>).ptr;
      *ppTVar2 = *ppTVar2 + -1;
    }
    pqVar1 = &(this->super_QArrayDataPointer<VkSpecParser::TypedName>).size;
    *pqVar1 = *pqVar1 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this).insertOne(i, std::move(tmp));
        }
    }